

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O2

void __thiscall
gl4cts::EnhancedLayouts::Utils::Buffer::Init
          (Buffer *this,BUFFERS buffer,USAGE usage,GLsizeiptr size,GLvoid *data)

{
  int iVar1;
  undefined4 extraout_var;
  Functions *gl;
  
  Release(this);
  this->m_buffer = buffer;
  iVar1 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar1);
  Generate(gl,&this->m_id);
  Bind(gl,this->m_id,this->m_buffer);
  Data(gl,this->m_buffer,usage,size,data);
  return;
}

Assistant:

void Buffer::Init(BUFFERS buffer, USAGE usage, GLsizeiptr size, GLvoid* data)
{
	/* Delete previous buffer instance */
	Release();

	m_buffer = buffer;

	const Functions& gl = m_context.getRenderContext().getFunctions();

	Generate(gl, m_id);
	Bind(gl, m_id, m_buffer);
	Data(gl, m_buffer, usage, size, data);
}